

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

heapelement_t * yanktop(heapelement_t ***heap,int32 heapsize,int32 *newsize)

{
  int iVar1;
  int iVar2;
  int32 iVar3;
  heapelement_t *phVar4;
  heapelement_t *l1;
  heapelement_t *l2;
  int32 iVar5;
  heapelement_t **pphVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  pphVar6 = *heap;
  phVar4 = *pphVar6;
  l1 = pphVar6[(long)heapsize + -1];
  *pphVar6 = l1;
  if (1 < heapsize) {
    iVar9 = heapsize + -2;
    iVar8 = 0;
    do {
      if (iVar9 <= iVar8 * 2) break;
      iVar1 = iVar8 * 2 + 1;
      iVar7 = iVar9;
      if (iVar1 != iVar9) {
        iVar2 = iVar8 * 2 + 2;
        iVar5 = compare(pphVar6[iVar2],pphVar6[iVar1]);
        iVar7 = iVar1;
        if (-1 < iVar5) {
          iVar7 = iVar2;
        }
      }
      l2 = pphVar6[iVar7];
      iVar5 = compare(l1,l2);
      if (-1 < iVar5) break;
      iVar5 = l1->heapid;
      iVar3 = l2->heapid;
      pphVar6[iVar8] = l2;
      pphVar6[iVar7] = l1;
      pphVar6[iVar8]->heapid = iVar5;
      l1->heapid = iVar3;
      iVar8 = iVar7;
    } while (iVar7 < heapsize + -1);
  }
  *newsize = heapsize + -1;
  pphVar6 = (heapelement_t **)realloc(pphVar6,((long)heapsize + -1) * 8);
  *heap = pphVar6;
  return phVar4;
}

Assistant:

heapelement_t *yanktop(heapelement_t ***heap, int32 heapsize, int32 *newsize)
{
    heapelement_t **lheap,*out;
    int32 left,right,high,id = 0,newheapsize;

    lheap = *heap;
    out = lheap[0];

    lheap[0] = lheap[heapsize-1];
    id = 0;
    while (id < heapsize-1) {
        left = LEFTCHILD(id);
        right = RIGHTCHILD(id);
        if (right > heapsize-2 && left > heapsize-2) break;
        if (left == heapsize-2) high = left;
        else {
            if (compare(lheap[right],lheap[left]) < 0) high = left;
            else high = right; 
        }
        if (compare(lheap[id],lheap[high]) < 0){
            SWAP(lheap[id],lheap[high]);
            id = high;
        }
        else break;
    }

    *newsize = newheapsize = heapsize-1;
    *heap = (heapelement_t**) realloc(lheap,newheapsize*sizeof(heapelement_t*));

    return(out);
}